

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::IsNanFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  ScalarFunctionSet *in_RDI;
  ScalarFunctionSet *funcs;
  allocator_type *in_stack_fffffffffffffb88;
  ScalarFunction *pSVar3;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffb90;
  ScalarFunction *pSVar4;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffb98;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *__f;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffba4;
  LogicalTypeId in_stack_fffffffffffffbaf;
  LogicalType *in_stack_fffffffffffffbb0;
  LogicalType *this;
  ScalarFunctionSet *in_stack_fffffffffffffbd0;
  undefined1 *local_3e8;
  undefined1 **local_3c8;
  bind_scalar_function_extended_t in_stack_fffffffffffffcb0;
  bind_scalar_function_extended_t bind_extended;
  pointer in_stack_fffffffffffffcb8;
  scalar_function_t *in_stack_fffffffffffffcc0;
  LogicalType *in_stack_fffffffffffffcc8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffcd0;
  vector<duckdb::LogicalType,_true> *arguments;
  ScalarFunction *in_stack_fffffffffffffcd8;
  ScalarFunction *this_00;
  function_statistics_t in_stack_fffffffffffffd10;
  init_local_state_t in_stack_fffffffffffffd18;
  LogicalType *in_stack_fffffffffffffd20;
  FunctionStability in_stack_fffffffffffffd28;
  FunctionNullHandling in_stack_fffffffffffffd30;
  bind_lambda_function_t in_stack_fffffffffffffd38;
  undefined1 local_1e0 [96];
  undefined8 *local_180;
  undefined1 *local_178 [3];
  undefined8 *local_160;
  undefined8 local_158;
  undefined1 local_9;
  
  local_9 = 0;
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffffbd0);
  local_180 = local_178;
  LogicalType::LogicalType(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbaf);
  local_160 = local_178;
  local_158 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x207684c);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffba0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffb98;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffba4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffb90,iVar1,in_stack_fffffffffffffb88);
  LogicalType::LogicalType(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbaf);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
            );
  LogicalType::LogicalType(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbaf);
  __f = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_1e0;
  this = (LogicalType *)0x0;
  uVar5 = 0;
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
             in_stack_fffffffffffffcc0,(bind_scalar_function_t)in_stack_fffffffffffffcb8,
             in_stack_fffffffffffffcb0,in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd38);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  LogicalType::~LogicalType((LogicalType *)0x2076940);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x207694d);
  LogicalType::~LogicalType((LogicalType *)0x207695a);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2076967);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2076974);
  local_3c8 = (undefined1 **)&local_160;
  do {
    local_3c8 = local_3c8 + -3;
    LogicalType::~LogicalType((LogicalType *)0x20769a9);
  } while (local_3c8 != local_178);
  bind_extended = (bind_scalar_function_extended_t)&stack0xfffffffffffffcb8;
  LogicalType::LogicalType(this,in_stack_fffffffffffffbaf);
  arguments = (vector<duckdb::LogicalType,_true> *)&stack0xfffffffffffffcb8;
  this_00 = (ScalarFunction *)0x1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2076a13);
  iVar2._M_len._0_4_ = uVar5;
  iVar2._M_array = (iterator)__f;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffba4;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar4,iVar2,(allocator_type *)pSVar3);
  LogicalType::LogicalType(this,in_stack_fffffffffffffbaf);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffba4,uVar5),__f);
  LogicalType::LogicalType(this,in_stack_fffffffffffffbaf);
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (this_00,arguments,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
             (bind_scalar_function_t)in_stack_fffffffffffffcb8,bind_extended,
             in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,in_stack_fffffffffffffd20,
             in_stack_fffffffffffffd28,in_stack_fffffffffffffd30,in_stack_fffffffffffffd38);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  LogicalType::~LogicalType((LogicalType *)0x2076b07);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x2076b14);
  LogicalType::~LogicalType((LogicalType *)0x2076b21);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2076b2e);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2076b3b);
  local_3e8 = &stack0xfffffffffffffcd0;
  do {
    local_3e8 = local_3e8 + -0x18;
    LogicalType::~LogicalType((LogicalType *)0x2076b70);
  } while (local_3e8 != &stack0xfffffffffffffcb8);
  return in_RDI;
}

Assistant:

ScalarFunctionSet IsNanFun::GetFunctions() {
	ScalarFunctionSet funcs;
	funcs.AddFunction(ScalarFunction({LogicalType::FLOAT}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<float, bool, IsNanOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<double, bool, IsNanOperator>));
	return funcs;
}